

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O2

void __thiscall
soplex::
SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::changeElement(SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this,int i,int j,
               number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *val,bool scale)

{
  uint *puVar1;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar2;
  Real eps;
  Item *pIVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  undefined1 uVar8;
  fpclass_type fVar9;
  int32_t iVar10;
  Item *this_00;
  int j_local;
  int i_local;
  Item *local_180;
  undefined1 local_178 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_170;
  uint local_168 [13];
  bool local_134;
  fpclass_type local_130;
  int32_t local_12c;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  uint local_d8;
  uint uStack_d4;
  uint uStack_d0;
  uint uStack_cc;
  uint local_c8;
  uint uStack_c4;
  uint uStack_c0;
  uint uStack_bc;
  uint local_b8;
  uint uStack_b4;
  uint uStack_b0;
  uint uStack_ac;
  uint local_a8;
  uint uStack_a4;
  uint uStack_a0;
  uint uStack_9c;
  int local_98;
  undefined1 local_94;
  undefined8 local_90;
  element_type *local_80;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_78;
  uint local_70 [2];
  uint auStack_68 [2];
  uint local_60 [2];
  uint auStack_58 [2];
  uint local_50 [2];
  uint auStack_48 [2];
  int local_40;
  undefined1 local_3c;
  fpclass_type local_38;
  int32_t local_34;
  
  if (-1 < (j | i)) {
    this_00 = (this->
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.theitem +
              (this->
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.thekey[i].idx;
    local_180 = (this->
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .set.theitem +
                (this->
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .set.thekey[j].idx;
    local_128.m_backend.data._M_elems._0_8_ = *(undefined8 *)(val->m_backend).data._M_elems;
    local_128.m_backend.data._M_elems._8_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 2);
    local_128.m_backend.data._M_elems._16_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 4);
    local_128.m_backend.data._M_elems._24_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 6);
    local_128.m_backend.data._M_elems._32_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 8);
    local_128.m_backend.data._M_elems._40_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 10);
    local_128.m_backend.data._M_elems._48_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 0xc)
    ;
    local_128.m_backend.data._M_elems._56_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 0xe)
    ;
    local_128.m_backend.exp = (val->m_backend).exp;
    local_128.m_backend.neg = (val->m_backend).neg;
    local_128.m_backend.fpclass = (val->m_backend).fpclass;
    local_128.m_backend.prec_elem = (val->m_backend).prec_elem;
    j_local = j;
    i_local = i;
    std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)local_178,
               &(this->_tolerances).
                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
    eps = Tolerances::epsilon((Tolerances *)local_178);
    bVar4 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                      (&local_128,eps);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_170);
    if (bVar4) {
      local_168[8] = 0;
      local_168[9] = 0;
      local_168[10] = 0;
      local_168[0xb] = 0;
      local_168[4] = 0;
      local_168[5] = 0;
      local_168[6] = 0;
      local_168[7] = 0;
      local_168[0] = 0;
      local_168[1] = 0;
      local_168[2] = 0;
      local_168[3] = 0;
      local_178 = (undefined1  [8])0x0;
      _Stack_170._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (scale) {
        local_d8 = (val->m_backend).data._M_elems[0];
        uStack_d4 = (val->m_backend).data._M_elems[1];
        uStack_d0 = (val->m_backend).data._M_elems[2];
        uStack_cc = (val->m_backend).data._M_elems[3];
        local_c8 = (val->m_backend).data._M_elems[4];
        uStack_c4 = (val->m_backend).data._M_elems[5];
        uStack_c0 = (val->m_backend).data._M_elems[6];
        uStack_bc = (val->m_backend).data._M_elems[7];
        local_b8 = (val->m_backend).data._M_elems[8];
        uStack_b4 = (val->m_backend).data._M_elems[9];
        uStack_b0 = (val->m_backend).data._M_elems[10];
        uStack_ac = (val->m_backend).data._M_elems[0xb];
        local_a8 = (val->m_backend).data._M_elems[0xc];
        uStack_a4 = (val->m_backend).data._M_elems[0xd];
        uStack_a0 = (val->m_backend).data._M_elems[0xe];
        uStack_9c = (val->m_backend).data._M_elems[0xf];
        local_98 = (val->m_backend).exp;
        local_94 = (val->m_backend).neg;
        local_90._0_4_ = (val->m_backend).fpclass;
        local_90._4_4_ = (val->m_backend).prec_elem;
        (*this->lp_scaler->_vptr_SPxScaler[0x2a])(&local_80,this->lp_scaler,this,i,(ulong)(uint)j);
        local_168[8] = local_50[0];
        local_168[9] = local_50[1];
        local_168[10] = auStack_48[0];
        local_168[0xb] = auStack_48[1];
        local_168[4] = local_60[0];
        local_168[5] = local_60[1];
        local_168[6] = auStack_58[0];
        local_168[7] = auStack_58[1];
        local_168[0] = local_70[0];
        local_168[1] = local_70[1];
        local_168[2] = auStack_68[0];
        local_168[3] = auStack_68[1];
        local_178 = (undefined1  [8])local_80;
        _Stack_170._M_pi = p_Stack_78;
        iVar5 = local_40;
        uVar8 = local_3c;
        fVar9 = local_38;
        iVar10 = local_34;
      }
      else {
        local_178 = *(undefined1 (*) [8])(val->m_backend).data._M_elems;
        _Stack_170._M_pi =
             *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((val->m_backend).data._M_elems + 2);
        local_168._0_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 4);
        local_168._8_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 6);
        local_168._16_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 8);
        local_168._24_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 10);
        local_168._32_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 0xc);
        local_168._40_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 0xe);
        iVar5 = (val->m_backend).exp;
        uVar8 = (val->m_backend).neg;
        fVar9 = (val->m_backend).fpclass;
        iVar10 = (val->m_backend).prec_elem;
      }
      local_168[0xc] = iVar5;
      local_134 = (bool)uVar8;
      local_130 = fVar9;
      local_12c = iVar10;
      iVar7 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::pos((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)this_00,j);
      pIVar3 = local_180;
      if ((-1 < iVar7) &&
         (iVar7 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::pos((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)local_180,i), -1 < iVar7)) {
        iVar7 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::pos((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)this_00,j);
        pNVar2 = (this_00->data).
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .m_elem;
        *(undefined1 (*) [8])pNVar2[iVar7].val.m_backend.data._M_elems = local_178;
        *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
         (pNVar2[iVar7].val.m_backend.data._M_elems + 2) = _Stack_170._M_pi;
        puVar1 = pNVar2[iVar7].val.m_backend.data._M_elems + 4;
        *(undefined8 *)puVar1 = local_168._0_8_;
        *(undefined8 *)(puVar1 + 2) = local_168._8_8_;
        puVar1 = pNVar2[iVar7].val.m_backend.data._M_elems + 8;
        *(undefined8 *)puVar1 = local_168._16_8_;
        *(undefined8 *)(puVar1 + 2) = local_168._24_8_;
        puVar1 = pNVar2[iVar7].val.m_backend.data._M_elems + 0xc;
        *(undefined8 *)puVar1 = local_168._32_8_;
        *(undefined8 *)(puVar1 + 2) = local_168._40_8_;
        pNVar2[iVar7].val.m_backend.exp = iVar5;
        pNVar2[iVar7].val.m_backend.neg = (bool)uVar8;
        pNVar2[iVar7].val.m_backend.fpclass = fVar9;
        pNVar2[iVar7].val.m_backend.prec_elem = iVar10;
        iVar7 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::pos((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)pIVar3,i);
        pNVar2 = (pIVar3->data).
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .m_elem;
        *(undefined1 (*) [8])pNVar2[iVar7].val.m_backend.data._M_elems = local_178;
        *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
         (pNVar2[iVar7].val.m_backend.data._M_elems + 2) = _Stack_170._M_pi;
        puVar1 = pNVar2[iVar7].val.m_backend.data._M_elems + 4;
        *(undefined8 *)puVar1 = local_168._0_8_;
        *(undefined8 *)(puVar1 + 2) = local_168._8_8_;
        puVar1 = pNVar2[iVar7].val.m_backend.data._M_elems + 8;
        *(undefined8 *)puVar1 = local_168._16_8_;
        *(undefined8 *)(puVar1 + 2) = local_168._24_8_;
        puVar1 = pNVar2[iVar7].val.m_backend.data._M_elems + 0xc;
        *(undefined8 *)puVar1 = local_168._32_8_;
        *(undefined8 *)(puVar1 + 2) = local_168._40_8_;
        pNVar2[iVar7].val.m_backend.exp = iVar5;
        pNVar2[iVar7].val.m_backend.neg = (bool)uVar8;
        pNVar2[iVar7].val.m_backend.fpclass = fVar9;
        pNVar2[iVar7].val.m_backend.prec_elem = iVar10;
        return;
      }
      LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::add2(&this->
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ,i,1,&j_local,
             (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)local_178);
      LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::add2(&this->
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ,j_local,1,&i_local,
             (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)local_178);
    }
    else {
      iVar5 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::pos((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)this_00,j);
      pIVar3 = local_180;
      if ((-1 < iVar5) &&
         (iVar5 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::pos((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)local_180,i), -1 < iVar5)) {
        uVar6 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::pos((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)this_00,j);
        SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::remove((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)this_00,(char *)(ulong)uVar6);
        uVar6 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::pos((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)pIVar3,i);
        SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::remove((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)pIVar3,(char *)(ulong)uVar6);
      }
    }
  }
  return;
}

Assistant:

virtual void changeElement(int i, int j, const R& val, bool scale = false)
   {
      if(i < 0 || j < 0)
         return;

      SVectorBase<R>& row = rowVector_w(i);
      SVectorBase<R>& col = colVector_w(j);

      if(isNotZero(val, this->tolerances()->epsilon()))
      {
         R newVal;

         if(scale)
         {
            assert(_isScaled);
            assert(lp_scaler);
            newVal = lp_scaler->scaleElement(*this, i, j, val);
         }
         else
            newVal = val;

         if(row.pos(j) >= 0 && col.pos(i) >= 0)
         {
            row.value(row.pos(j)) = newVal;
            col.value(col.pos(i)) = newVal;
         }
         else
         {
            LPRowSetBase<R>::add2(i, 1, &j, &newVal);
            LPColSetBase<R>::add2(j, 1, &i, &newVal);
         }
      }
      else if(row.pos(j) >= 0 && col.pos(i) >= 0)
      {
         row.remove(row.pos(j));
         col.remove(col.pos(i));
      }

      assert(isConsistent());
   }